

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall gss::innards::Proof::finish_unsat_proof(Proof *this)

{
  long *plVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* asserting that we\'ve proved unsat\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"u >= 1 ;\n",9);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var2._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  uVar3._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       ((_Var2._M_head_impl)->proof_stream)._M_t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar3._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"output NONE\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar3._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"conclusion UNSAT : -1\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar3._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"end pseudo-Boolean proof\n",0x19);
  return;
}

Assistant:

auto Proof::finish_unsat_proof() -> void
{
    *_imp->proof_stream << "* asserting that we've proved unsat\n";
    *_imp->proof_stream << "u >= 1 ;\n";
    ++_imp->proof_line;
    *_imp->proof_stream << "output NONE\n"
                        << "conclusion UNSAT : -1\n"
                        << "end pseudo-Boolean proof\n";
}